

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_stream_control_frames(quicly_conn_t *conn,quicly_send_context_t *s)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  quicly_send_context_t *unaff_retaddr;
  quicly_stream_t *stream;
  int ret;
  undefined4 local_14;
  
  local_14 = 0;
  while( true ) {
    bVar2 = false;
    if (*(long *)(in_RSI + 0x38) != *(long *)(in_RSI + 0x30)) {
      iVar1 = quicly_linklist_is_linked((quicly_linklist_t *)(in_RDI + 0x7a8));
      bVar2 = iVar1 != 0;
    }
    if ((!bVar2) || (local_14 = send_control_frames_of_stream(stream,unaff_retaddr), local_14 != 0))
    break;
    quicly_linklist_unlink((quicly_linklist_t *)0x144dd6);
  }
  return local_14;
}

Assistant:

static int send_stream_control_frames(quicly_conn_t *conn, quicly_send_context_t *s)
{
    int ret = 0;

    while (s->num_datagrams != s->max_datagrams && quicly_linklist_is_linked(&conn->egress.pending_streams.control)) {
        quicly_stream_t *stream =
            (void *)((char *)conn->egress.pending_streams.control.next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if ((ret = send_control_frames_of_stream(stream, s)) != 0)
            goto Exit;
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
    }

Exit:
    return ret;
}